

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  _List_node_base *exp;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  pointer rhss;
  ostream *poVar8;
  size_t sVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  PolicyID id;
  _Self __tmp;
  _List_node_base *p_Var11;
  cmExpandedCommandArgument *pcVar12;
  _Self __tmp_1;
  iterator __position;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  undefined8 uVar14;
  cmConditionEvaluator *pcVar15;
  cmMakefile *pcVar16;
  CompareOp op;
  iterator iVar17;
  cmExpandedCommandArgument *pcVar18;
  iterator argP2;
  int reducible;
  iterator arg;
  double rhs;
  char *def;
  string def_buf;
  ostringstream error;
  RegularExpression regEntry;
  iterator local_300;
  int local_2f4;
  iterator local_2f0;
  iterator local_2e8;
  string local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  char *local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  _List_node_base *local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  undefined1 local_270;
  ios_base local_220 [264];
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [10];
  char *local_60;
  string *local_40;
  pointer local_38;
  
  local_2b8 = &local_2a8;
  local_2b0 = (char *)0x0;
  local_2a8._M_local_buf[0] = '\0';
  local_298 = (_List_node_base *)newArgs;
  local_40 = errorString;
  local_38 = (pointer)status;
  while( true ) {
    local_2f4 = 0;
    p_Var11 = ((_List_node_base *)newArgs)->_M_next;
    local_300._M_node = (_List_node_base *)0x0;
    local_2e8._M_node = p_Var11;
    if (p_Var11 == (_List_node_base *)newArgs) break;
    do {
      __position._M_node = p_Var11;
      local_2e8._M_node = p_Var11;
      if (p_Var11 == (_List_node_base *)newArgs) {
LAB_002ab5f2:
        local_2f0._M_node = __position._M_node;
        if ((__position._M_node != (_List_node_base *)newArgs) &&
           (local_300._M_node != (_List_node_base *)newArgs)) {
          local_290._M_allocated_capacity = (size_type)&local_280;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"MATCHES","");
          bVar1 = IsKeyword(this,(string *)&local_290,
                            (cmExpandedCommandArgument *)(__position._M_node + 1));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_allocated_capacity != &local_280) {
            operator_delete((void *)local_290._M_allocated_capacity,
                            local_280._M_allocated_capacity + 1);
          }
          if (bVar1) {
            pcVar12 = (cmExpandedCommandArgument *)(p_Var11 + 1);
            paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)GetDefinitionIfUnquoted(this,pcVar12);
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pcVar12->Value)._M_dataplus._M_p;
            if (paVar5 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
              paVar5 = paVar13;
            }
            local_2c0 = paVar5;
            if ((paVar5 != paVar13) &&
               (iVar3 = strncmp(paVar13->_M_local_buf,"CMAKE_MATCH_",0xc), pcVar7 = local_2b0,
               iVar3 == 0)) {
              strlen(paVar5->_M_local_buf);
              std::__cxx11::string::_M_replace((ulong)&local_2b8,0,pcVar7,(ulong)paVar5);
              local_2c0 = local_2b8;
            }
            iVar17._M_node = local_300._M_node;
            exp = local_300._M_node[1]._M_next;
            cmMakefile::ClearMatches(this->Makefile);
            local_60 = (char *)0x0;
            bVar1 = cmsys::RegularExpression::compile((RegularExpression *)local_118,(char *)exp);
            if (bVar1) {
              bVar2 = cmsys::RegularExpression::find
                                ((RegularExpression *)local_118,local_2c0->_M_local_buf);
              if (bVar2) {
                cmMakefile::StoreMatches(this->Makefile,(RegularExpression *)local_118);
                local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"1","");
                local_290._M_allocated_capacity = (size_type)&local_280;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_290,local_2e0._M_dataplus._M_p,
                           local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
              }
              else {
                local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"0","");
                local_290._M_allocated_capacity = (size_type)&local_280;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_290,local_2e0._M_dataplus._M_p,
                           local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
              }
              local_270 = 1;
              std::__cxx11::string::operator=((string *)pcVar12,(string *)local_290._M_local_buf);
              *(undefined1 *)&p_Var11[3]._M_next = local_270;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_allocated_capacity != &local_280) {
                operator_delete((void *)local_290._M_allocated_capacity,
                                local_280._M_allocated_capacity + 1);
              }
              newArgs = (cmArgumentList *)local_298;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                operator_delete(local_2e0._M_dataplus._M_p,
                                local_2e0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::
              list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::_M_erase
                        (newArgs,iVar17);
              std::__cxx11::
              list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::_M_erase
                        (newArgs,__position);
              local_2f0._M_node = local_2e8._M_node;
              if ((local_2e8._M_node != (_List_node_base *)newArgs) &&
                 (local_2f0._M_node = (local_2e8._M_node)->_M_next,
                 local_300._M_node = local_2f0._M_node,
                 local_2f0._M_node != (_List_node_base *)newArgs)) {
                local_300._M_node = (local_2f0._M_node)->_M_next;
              }
              local_2f4 = 1;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290._M_local_buf);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_290,"Regular expression \"",0x14);
              if (exp == (_List_node_base *)0x0) {
                std::ios::clear((int)&stack0xfffffffffffffce8 +
                                (int)*(undefined8 *)(local_290._M_allocated_capacity - 0x18) + 0x88)
                ;
              }
              else {
                sVar9 = strlen((char *)exp);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_290,(char *)exp,sVar9);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_290,"\" cannot compile",0x10);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)local_40,(string *)&local_2e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                operator_delete(local_2e0._M_dataplus._M_p,
                                local_2e0.field_2._M_allocated_capacity + 1);
              }
              *(undefined4 *)&(local_38->_M_dataplus)._M_p = 2;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290._M_local_buf);
              std::ios_base::~ios_base(local_220);
            }
            if (local_60 != (char *)0x0) {
              operator_delete__(local_60);
            }
            __position._M_node = local_2f0._M_node;
            if (!bVar1) {
              bVar1 = false;
              goto LAB_002ac824;
            }
          }
        }
      }
      else {
        local_300._M_node = p_Var11->_M_next;
        __position._M_node = local_300._M_node;
        local_2f0._M_node = local_300._M_node;
        if (local_300._M_node != (_List_node_base *)newArgs) {
          local_300._M_node = (local_300._M_node)->_M_next;
          goto LAB_002ab5f2;
        }
      }
      if (__position._M_node != (_List_node_base *)newArgs) {
        local_290._M_allocated_capacity = (size_type)&local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"MATCHES","");
        iVar17._M_node = local_2e8._M_node;
        pcVar12 = (cmExpandedCommandArgument *)(local_2e8._M_node + 1);
        bVar1 = IsKeyword(this,(string *)&local_290,pcVar12);
        newArgs = (cmArgumentList *)local_298;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_allocated_capacity != &local_280) {
          operator_delete((void *)local_290._M_allocated_capacity,
                          local_280._M_allocated_capacity + 1);
        }
        if (bVar1) {
          local_118 = (undefined1  [8])local_108;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"0","");
          local_290._M_allocated_capacity = (size_type)&local_280;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_290,local_118,
                     (char *)((long)local_118 + (long)&pbStack_110->_M_dataplus));
          local_270 = 1;
          std::__cxx11::string::operator=((string *)pcVar12,(string *)local_290._M_local_buf);
          *(undefined1 *)&iVar17._M_node[3]._M_next = local_270;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_allocated_capacity != &local_280) {
            operator_delete((void *)local_290._M_allocated_capacity,
                            local_280._M_allocated_capacity + 1);
          }
          newArgs = (cmArgumentList *)local_298;
          if (local_118 != (undefined1  [8])local_108) {
            operator_delete((void *)local_118,(ulong)(local_108[0]._M_allocated_capacity + 1));
          }
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,__position);
          local_2f0._M_node = local_2e8._M_node;
          if ((local_2e8._M_node != (_List_node_base *)newArgs) &&
             (local_2f0._M_node = (local_2e8._M_node)->_M_next,
             local_300._M_node = local_2f0._M_node, local_2f0._M_node != (_List_node_base *)newArgs)
             ) {
            local_300._M_node = (local_2f0._M_node)->_M_next;
          }
          local_2f4 = 1;
          __position._M_node = local_2f0._M_node;
        }
      }
      iVar17._M_node = local_300._M_node;
      if (local_300._M_node != (_List_node_base *)newArgs &&
          __position._M_node != (_List_node_base *)newArgs) {
        local_290._M_allocated_capacity = (size_type)&local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"LESS","");
        pcVar12 = (cmExpandedCommandArgument *)(__position._M_node + 1);
        bVar1 = IsKeyword(this,(string *)&local_290,pcVar12);
        bVar2 = true;
        if (!bVar1) {
          local_118 = (undefined1  [8])local_108;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"GREATER","");
          bVar1 = IsKeyword(this,(string *)local_118,pcVar12);
          bVar2 = true;
          if (!bVar1) {
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"EQUAL","");
            bVar2 = IsKeyword(this,&local_2e0,pcVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_118 != (undefined1  [8])local_108) {
            operator_delete((void *)local_118,(ulong)(local_108[0]._M_allocated_capacity + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_allocated_capacity != &local_280) {
          operator_delete((void *)local_290._M_allocated_capacity,
                          local_280._M_allocated_capacity + 1);
        }
        if (bVar2 != false) {
          pcVar18 = (cmExpandedCommandArgument *)(local_2e8._M_node + 1);
          local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)GetDefinitionIfUnquoted(this,pcVar18);
          if (local_2c0 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pcVar18->Value)._M_dataplus._M_p;
          }
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)GetDefinitionIfUnquoted
                                (this,(cmExpandedCommandArgument *)(iVar17._M_node + 1));
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(((cmExpandedCommandArgument *)(iVar17._M_node + 1))->Value)._M_dataplus._M_p;
          bVar1 = false;
          paVar13 = local_2c0;
          iVar3 = __isoc99_sscanf(local_2c0,"%lg",local_118);
          if (iVar3 == 1) {
            paVar13 = paVar5;
            if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
              paVar13 = paVar6;
            }
            bVar1 = false;
            iVar3 = __isoc99_sscanf(paVar13,"%lg",&local_2e0);
            if (iVar3 == 1) {
              local_290._M_allocated_capacity = (size_type)&local_280;
              paVar13 = &local_290;
              std::__cxx11::string::_M_construct<char_const*>((string *)paVar13,"LESS","");
              uVar14 = local_290._M_allocated_capacity;
              p_Var11 = __position._M_node[1]._M_prev;
              if (p_Var11 == (_List_node_base *)local_290._8_8_) {
                if (p_Var11 == (_List_node_base *)0x0) {
                  bVar1 = true;
                }
                else {
                  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(pcVar12->Value)._M_dataplus._M_p;
                  iVar3 = bcmp(paVar13,(void *)local_290._M_allocated_capacity,(size_t)p_Var11);
                  bVar1 = iVar3 == 0;
                }
              }
              else {
                bVar1 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar14 != &local_280) {
                operator_delete((void *)uVar14,local_280._M_allocated_capacity + 1);
                paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)uVar14;
              }
              if (bVar1) {
                bVar1 = (double)local_2e0._M_dataplus._M_p == (double)local_118;
                bVar2 = (double)local_2e0._M_dataplus._M_p < (double)local_118;
              }
              else {
                local_290._M_allocated_capacity = (size_type)&local_280;
                paVar13 = &local_290;
                std::__cxx11::string::_M_construct<char_const*>((string *)paVar13,"GREATER","");
                uVar14 = local_290._M_allocated_capacity;
                p_Var11 = __position._M_node[1]._M_prev;
                if (p_Var11 == (_List_node_base *)local_290._8_8_) {
                  if (p_Var11 == (_List_node_base *)0x0) {
                    bVar1 = true;
                  }
                  else {
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(pcVar12->Value)._M_dataplus._M_p;
                    iVar3 = bcmp(paVar13,(void *)local_290._M_allocated_capacity,(size_t)p_Var11);
                    bVar1 = iVar3 == 0;
                  }
                }
                else {
                  bVar1 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)uVar14 != &local_280) {
                  operator_delete((void *)uVar14,local_280._M_allocated_capacity + 1);
                  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)uVar14;
                }
                if (!bVar1) {
                  bVar1 = (bool)(-((double)local_118 == (double)local_2e0._M_dataplus._M_p) & 1);
                  goto LAB_002abe4f;
                }
                bVar1 = (double)local_118 == (double)local_2e0._M_dataplus._M_p;
                bVar2 = (double)local_118 < (double)local_2e0._M_dataplus._M_p;
              }
              bVar1 = !bVar2 && !bVar1;
            }
          }
LAB_002abe4f:
          HandleBinaryOp((cmConditionEvaluator *)paVar13,bVar1,&local_2f4,&local_2e8,newArgs,
                         &local_2f0,&local_300);
          __position._M_node = local_2f0._M_node;
          iVar17._M_node = local_300._M_node;
        }
      }
      if (iVar17._M_node != (_List_node_base *)newArgs &&
          __position._M_node != (_List_node_base *)newArgs) {
        local_290._M_allocated_capacity = (size_type)&local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"STRLESS","");
        pcVar12 = (cmExpandedCommandArgument *)(__position._M_node + 1);
        bVar1 = IsKeyword(this,(string *)&local_290,pcVar12);
        bVar2 = true;
        if (!bVar1) {
          local_118 = (undefined1  [8])local_108;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"STREQUAL","");
          bVar1 = IsKeyword(this,(string *)local_118,pcVar12);
          bVar2 = true;
          if (!bVar1) {
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"STRGREATER","");
            bVar2 = IsKeyword(this,&local_2e0,pcVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_118 != (undefined1  [8])local_108) {
            operator_delete((void *)local_118,(ulong)(local_108[0]._M_allocated_capacity + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_allocated_capacity != &local_280) {
          operator_delete((void *)local_290._M_allocated_capacity,
                          local_280._M_allocated_capacity + 1);
        }
        if (bVar2 != false) {
          pcVar18 = (cmExpandedCommandArgument *)(local_2e8._M_node + 1);
          local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)GetDefinitionIfUnquoted(this,pcVar18);
          if (local_2c0 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pcVar18->Value)._M_dataplus._M_p;
          }
          pcVar7 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar17._M_node + 1));
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (((cmExpandedCommandArgument *)(iVar17._M_node + 1))->Value)._M_dataplus._M_p;
          }
          iVar3 = strcmp(local_2c0->_M_local_buf,pcVar7);
          local_290._M_allocated_capacity = (size_type)&local_280;
          paVar13 = &local_290;
          std::__cxx11::string::_M_construct<char_const*>((string *)paVar13,"STRLESS","");
          uVar14 = local_290._M_allocated_capacity;
          p_Var11 = __position._M_node[1]._M_prev;
          if (p_Var11 == (_List_node_base *)local_290._8_8_) {
            if (p_Var11 == (_List_node_base *)0x0) {
              bVar1 = true;
            }
            else {
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pcVar12->Value)._M_dataplus._M_p;
              iVar4 = bcmp(paVar13,(void *)local_290._M_allocated_capacity,(size_t)p_Var11);
              bVar1 = iVar4 == 0;
            }
          }
          else {
            bVar1 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar14 != &local_280) {
            operator_delete((void *)uVar14,local_280._M_allocated_capacity + 1);
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)uVar14;
          }
          if (bVar1) {
            bVar1 = SUB41((uint)iVar3 >> 0x1f,0);
          }
          else {
            local_290._M_allocated_capacity = (size_type)&local_280;
            paVar13 = &local_290;
            std::__cxx11::string::_M_construct<char_const*>((string *)paVar13,"STRGREATER","");
            uVar14 = local_290._M_allocated_capacity;
            p_Var11 = __position._M_node[1]._M_prev;
            if (p_Var11 == (_List_node_base *)local_290._8_8_) {
              if (p_Var11 == (_List_node_base *)0x0) {
                bVar1 = true;
              }
              else {
                paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pcVar12->Value)._M_dataplus._M_p;
                iVar4 = bcmp(paVar13,(void *)local_290._M_allocated_capacity,(size_t)p_Var11);
                bVar1 = iVar4 == 0;
              }
            }
            else {
              bVar1 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar14 != &local_280) {
              operator_delete((void *)uVar14,local_280._M_allocated_capacity + 1);
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)uVar14;
            }
            if (bVar1) {
              bVar1 = 0 < iVar3;
            }
            else {
              bVar1 = iVar3 == 0;
            }
          }
          HandleBinaryOp((cmConditionEvaluator *)paVar13,bVar1,&local_2f4,&local_2e8,newArgs,
                         &local_2f0,&local_300);
          __position._M_node = local_2f0._M_node;
          iVar17._M_node = local_300._M_node;
        }
      }
      if (iVar17._M_node != (_List_node_base *)newArgs &&
          __position._M_node != (_List_node_base *)newArgs) {
        local_290._M_allocated_capacity = (size_type)&local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"VERSION_LESS","");
        pcVar12 = (cmExpandedCommandArgument *)(__position._M_node + 1);
        bVar1 = IsKeyword(this,(string *)&local_290,pcVar12);
        bVar2 = true;
        if (!bVar1) {
          local_118 = (undefined1  [8])local_108;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"VERSION_GREATER","");
          bVar1 = IsKeyword(this,(string *)local_118,pcVar12);
          bVar2 = true;
          if (!bVar1) {
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"VERSION_EQUAL","")
            ;
            bVar2 = IsKeyword(this,&local_2e0,pcVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_118 != (undefined1  [8])local_108) {
            operator_delete((void *)local_118,(ulong)(local_108[0]._M_allocated_capacity + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_allocated_capacity != &local_280) {
          operator_delete((void *)local_290._M_allocated_capacity,
                          local_280._M_allocated_capacity + 1);
        }
        if (bVar2 != false) {
          pcVar18 = (cmExpandedCommandArgument *)(local_2e8._M_node + 1);
          local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)GetDefinitionIfUnquoted(this,pcVar18);
          if (local_2c0 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pcVar18->Value)._M_dataplus._M_p;
          }
          rhss = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar17._M_node + 1));
          if (rhss == (char *)0x0) {
            rhss = (((cmExpandedCommandArgument *)(iVar17._M_node + 1))->Value)._M_dataplus._M_p;
          }
          local_290._M_allocated_capacity = (size_type)&local_280;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"VERSION_LESS","");
          uVar14 = local_290._M_allocated_capacity;
          p_Var11 = __position._M_node[1]._M_prev;
          if (p_Var11 == (_List_node_base *)local_290._8_8_) {
            if (p_Var11 == (_List_node_base *)0x0) {
              bVar1 = true;
            }
            else {
              iVar3 = bcmp((pcVar12->Value)._M_dataplus._M_p,(void *)local_290._M_allocated_capacity
                           ,(size_t)p_Var11);
              bVar1 = iVar3 == 0;
            }
          }
          else {
            bVar1 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar14 != &local_280) {
            operator_delete((void *)uVar14,local_280._M_allocated_capacity + 1);
          }
          op = OP_LESS;
          if (!bVar1) {
            local_290._M_allocated_capacity = (size_type)&local_280;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_290,"VERSION_GREATER","");
            uVar14 = local_290._M_allocated_capacity;
            p_Var11 = __position._M_node[1]._M_prev;
            if (p_Var11 == (_List_node_base *)local_290._8_8_) {
              if (p_Var11 == (_List_node_base *)0x0) {
                op = OP_GREATER;
              }
              else {
                iVar3 = bcmp((pcVar12->Value)._M_dataplus._M_p,
                             (void *)local_290._M_allocated_capacity,(size_t)p_Var11);
                op = OP_EQUAL - (iVar3 == 0);
              }
            }
            else {
              op = OP_EQUAL;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar14 != &local_280) {
              operator_delete((void *)uVar14,local_280._M_allocated_capacity + 1);
            }
          }
          pcVar15 = (cmConditionEvaluator *)(ulong)op;
          bVar1 = cmSystemTools::VersionCompare(op,local_2c0->_M_local_buf,rhss);
          HandleBinaryOp(pcVar15,bVar1,&local_2f4,&local_2e8,newArgs,&local_2f0,&local_300);
          __position._M_node = local_2f0._M_node;
          iVar17._M_node = local_300._M_node;
        }
      }
      if ((__position._M_node != (_List_node_base *)newArgs) &&
         (iVar17._M_node != (_List_node_base *)newArgs)) {
        local_290._M_allocated_capacity = (size_type)&local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"IS_NEWER_THAN","");
        bVar1 = IsKeyword(this,(string *)&local_290,
                          (cmExpandedCommandArgument *)(__position._M_node + 1));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_allocated_capacity != &local_280) {
          operator_delete((void *)local_290._M_allocated_capacity,
                          local_280._M_allocated_capacity + 1);
        }
        if (bVar1) {
          local_290._M_allocated_capacity = local_290._M_allocated_capacity & 0xffffffff00000000;
          pcVar15 = (cmConditionEvaluator *)(local_2e8._M_node + 1);
          bVar1 = cmsys::SystemTools::FileTimeCompare
                            ((string *)pcVar15,(string *)(iVar17._M_node + 1),
                             (int *)local_290._M_local_buf);
          HandleBinaryOp(pcVar15,(uint)local_290._M_allocated_capacity._0_4_ < 2 || !bVar1,
                         &local_2f4,&local_2e8,newArgs,&local_2f0,&local_300);
          __position._M_node = local_2f0._M_node;
          iVar17._M_node = local_300._M_node;
        }
      }
      if ((__position._M_node != (_List_node_base *)newArgs) &&
         (iVar17._M_node != (_List_node_base *)newArgs)) {
        local_290._M_allocated_capacity = (size_type)&local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"IN_LIST","");
        bVar1 = IsKeyword(this,(string *)&local_290,
                          (cmExpandedCommandArgument *)(__position._M_node + 1));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_allocated_capacity != &local_280) {
          operator_delete((void *)local_290._M_allocated_capacity,
                          local_280._M_allocated_capacity + 1);
        }
        if (bVar1) {
          if (this->Policy57Status < NEW) {
            if (this->Policy57Status == WARN) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290._M_local_buf);
              cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_118,(cmPolicies *)0x39,id);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_290,(char *)local_118,(long)pbStack_110);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if (local_118 != (undefined1  [8])local_108) {
                operator_delete((void *)local_118,(ulong)(local_108[0]._M_allocated_capacity + 1));
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_290,
                         "IN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                         ,0x85);
              pcVar16 = this->Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(pcVar16,AUTHOR_WARNING,(string *)local_118,false);
              if (local_118 != (undefined1  [8])local_108) {
                operator_delete((void *)local_118,(ulong)(local_108[0]._M_allocated_capacity + 1));
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290._M_local_buf);
              std::ios_base::~ios_base(local_220);
            }
          }
          else {
            pcVar12 = (cmExpandedCommandArgument *)(local_2e8._M_node + 1);
            local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)GetDefinitionIfUnquoted(this,pcVar12);
            if (local_2c0 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pcVar12->Value)._M_dataplus._M_p;
            }
            pcVar16 = this->Makefile;
            pcVar7 = cmMakefile::GetDefinition(pcVar16,(string *)(iVar17._M_node + 1));
            if (pcVar7 == (char *)0x0) {
              bVar1 = false;
            }
            else {
              local_118 = (undefined1  [8])0x0;
              pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
              ;
              local_108[0]._M_allocated_capacity = (char *)0x0;
              local_290._M_allocated_capacity = (size_type)&local_280;
              sVar9 = strlen(pcVar7);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_290,pcVar7,pcVar7 + sVar9);
              cmSystemTools::ExpandListArgument
                        ((string *)&local_290,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_118,true);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_allocated_capacity != &local_280) {
                operator_delete((void *)local_290._M_allocated_capacity,
                                local_280._M_allocated_capacity + 1);
              }
              _Var10 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                                 (local_118,pbStack_110,&local_2c0);
              bVar1 = _Var10._M_current != pbStack_110;
              pcVar16 = (cmMakefile *)local_118;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)pcVar16);
            }
            HandleBinaryOp((cmConditionEvaluator *)pcVar16,bVar1,&local_2f4,&local_2e8,newArgs,
                           &local_2f0,&local_300);
          }
        }
      }
      p_Var11 = (local_2e8._M_node)->_M_next;
    } while (p_Var11 != (_List_node_base *)newArgs);
    local_2e8._M_node = p_Var11;
    if (local_2f4 == 0) break;
  }
  bVar1 = true;
LAB_002ac824:
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,
                    CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  std::string def_buf;
  const char *def;
  const char *def2;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      this->IncrementArguments(newArgs,argP1,argP2);
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        IsKeyword("MATCHES", *argP1))
        {
        def = this->GetVariableOrString(*arg);
        if (def != arg->c_str() // yes, we compare the pointer value
            && cmHasLiteralPrefix(arg->GetValue(), "CMAKE_MATCH_"))
          {
          // The string to match is owned by our match result variables.
          // Move it to our own buffer before clearing them.
          def_buf = def;
          def = def_buf.c_str();
          }
        const char* rex = argP2->c_str();
        this->Makefile.ClearMatches();
        cmsys::RegularExpression regEntry;
        if ( !regEntry.compile(rex) )
          {
          std::ostringstream error;
          error << "Regular expression \"" << rex << "\" cannot compile";
          errorString = error.str();
          status = cmake::FATAL_ERROR;
          return false;
          }
        if (regEntry.find(def))
          {
          this->Makefile.StoreMatches(regEntry);
          *arg = cmExpandedCommandArgument("1", true);
          }
        else
          {
          *arg = cmExpandedCommandArgument("0", true);
          }
        newArgs.erase(argP2);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs,argP1,argP2);
        reducible = 1;
        }

      if (argP1 != newArgs.end() && this->IsKeyword("MATCHES", *arg))
        {
        *arg = cmExpandedCommandArgument("0", true);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs,argP1,argP2);
        reducible = 1;
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("LESS", *argP1) ||
         this->IsKeyword("GREATER", *argP1) ||
         this->IsKeyword("EQUAL", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        double lhs;
        double rhs;
        bool result;
        if(sscanf(def, "%lg", &lhs) != 1 ||
           sscanf(def2, "%lg", &rhs) != 1)
          {
          result = false;
          }
        else if (*(argP1) == "LESS")
          {
          result = (lhs < rhs);
          }
        else if (*(argP1) == "GREATER")
          {
          result = (lhs > rhs);
          }
        else
          {
          result = (lhs == rhs);
          }
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("STRLESS", *argP1) ||
         this->IsKeyword("STREQUAL", *argP1) ||
         this->IsKeyword("STRGREATER", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        int val = strcmp(def,def2);
        bool result;
        if (*(argP1) == "STRLESS")
          {
          result = (val < 0);
          }
        else if (*(argP1) == "STRGREATER")
          {
          result = (val > 0);
          }
        else // strequal
          {
          result = (val == 0);
          }
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("VERSION_LESS", *argP1) ||
         this->IsKeyword("VERSION_GREATER", *argP1) ||
         this->IsKeyword("VERSION_EQUAL", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        cmSystemTools::CompareOp op = cmSystemTools::OP_EQUAL;
        if(*argP1 == "VERSION_LESS")
          {
          op = cmSystemTools::OP_LESS;
          }
        else if(*argP1 == "VERSION_GREATER")
          {
          op = cmSystemTools::OP_GREATER;
          }
        bool result = cmSystemTools::VersionCompare(op, def, def2);
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      // is file A newer than file B
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword("IS_NEWER_THAN", *argP1))
        {
        int fileIsNewer=0;
        bool success=cmSystemTools::FileTimeCompare(arg->GetValue(),
            (argP2)->GetValue(),
            &fileIsNewer);
        this->HandleBinaryOp(
          (success==false || fileIsNewer==1 || fileIsNewer==0),
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword("IN_LIST", *argP1))
        {
        if(this->Policy57Status != cmPolicies::OLD &&
          this->Policy57Status != cmPolicies::WARN)
          {
          bool result = false;

          def = this->GetVariableOrString(*arg);
          def2 = this->Makefile.GetDefinition(argP2->GetValue());

          if(def2)
            {
            std::vector<std::string> list;
            cmSystemTools::ExpandListArgument(def2, list, true);

            result = std::find(list.begin(), list.end(), def) != list.end();
            }

          this->HandleBinaryOp(result,
            reducible, arg, newArgs, argP1, argP2);
          }
          else if(this->Policy57Status == cmPolicies::WARN)
            {
            std::ostringstream e;
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057) << "\n";
            e << "IN_LIST will be interpreted as an operator "
              "when the policy is set to NEW.  "
              "Since the policy is not set the OLD behavior will be used.";

            this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
            }
        }

      ++arg;
      }
    }
  while (reducible);
  return true;
}